

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v7::detail::bigint::assign_pow10(bigint *this,int exp)

{
  uint uVar1;
  uint uVar2;
  
  if (exp < 0) {
    __assert_fail("exp >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                  ,0x2b4,"void fmt::detail::bigint::assign_pow10(int)");
  }
  if (exp != 0) {
    uVar1 = 1;
    do {
      uVar2 = uVar1;
      uVar1 = uVar2 * 2;
    } while ((int)uVar2 <= exp);
    assign(this,5);
    for (uVar2 = uVar2 >> 2; uVar2 != 0; uVar2 = uVar2 >> 1) {
      square(this);
      if ((uVar2 & exp) != 0) {
        multiply(this,5);
      }
    }
    operator<<=(this,exp);
    return;
  }
  assign(this,1);
  return;
}

Assistant:

void assign_pow10(int exp) {
    assert(exp >= 0);
    if (exp == 0) return assign(1);
    // Find the top bit.
    int bitmask = 1;
    while (exp >= bitmask) bitmask <<= 1;
    bitmask >>= 1;
    // pow(10, exp) = pow(5, exp) * pow(2, exp). First compute pow(5, exp) by
    // repeated squaring and multiplication.
    assign(5);
    bitmask >>= 1;
    while (bitmask != 0) {
      square();
      if ((exp & bitmask) != 0) *this *= 5;
      bitmask >>= 1;
    }
    *this <<= exp;  // Multiply by pow(2, exp) by shifting.
  }